

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void __thiscall duckdb::ZSTDCompressionState::FlushSegment(ZSTDCompressionState *this)

{
  BlockManager *pBVar1;
  BufferHandle *pBVar2;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var3;
  ColumnCheckpointState *pCVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_50;
  BufferHandle local_48;
  
  pCVar4 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  if ((this->current_buffer).ptr == &this->segment_handle) {
    optional_ptr<duckdb::BufferHandle,_true>::CheckValid(&this->current_buffer);
    pBVar2 = (this->current_buffer).ptr;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar2->node);
    uVar7 = (ulong)(uint)(*(int *)&this->current_buffer_ptr - *(int *)&((pBVar2->node).ptr)->buffer)
    ;
  }
  else {
    pBVar1 = (this->super_CompressionState).info.block_manager;
    iVar5 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
    iVar6 = optional_idx::GetIndex(&pBVar1->block_header_size);
    uVar7 = iVar5 - iVar6;
  }
  local_50._M_head_impl =
       (this->segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&local_48,&this->segment_handle);
  (*pCVar4->_vptr_ColumnCheckpointState[4])(pCVar4,&local_50,&local_48,uVar7);
  BufferHandle::~BufferHandle(&local_48);
  _Var3._M_head_impl = local_50._M_head_impl;
  if (local_50._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_50._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  this->segment_count = this->segment_count + 1;
  this->vector_in_segment_count = 0;
  return;
}

Assistant:

void FlushSegment() {
		auto &state = checkpoint_data.GetCheckpointState();
		idx_t segment_block_size;

		if (current_buffer.get() == &segment_handle) {
			segment_block_size = GetCurrentOffset();
		} else {
			// Block is fully used
			segment_block_size = info.GetBlockSize();
		}

		state.FlushSegment(std::move(segment), std::move(segment_handle), segment_block_size);
		segment_count++;
		vector_in_segment_count = 0;
	}